

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O3

int VP8LResidualImage(int width,int height,int min_bits,int max_bits,int low_effort,uint32_t *argb,
                     uint32_t *argb_scratch,uint32_t *image,int near_lossless_quality,int exact,
                     int used_subtract_green,WebPPicture *pic,int percent_range,int *percent,
                     int *best_bits)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  undefined1 auVar4 [16];
  uint32_t subsampling_index;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  VP8LPredictorAddSubFunc *pp_Var10;
  uint8_t *max_diffs;
  uint32_t *puVar11;
  uint32_t *puVar12;
  ulong uVar13;
  uint32_t *puVar14;
  int64_t iVar15;
  uint64_t uVar16;
  uint64_t uVar17;
  byte bVar18;
  byte bVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  ulong uVar27;
  uint32_t *puVar28;
  uint uVar29;
  uint uVar30;
  int iVar31;
  uint uVar32;
  ulong uVar33;
  uint uVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  uint uVar38;
  long lVar39;
  uint32_t *puVar40;
  long lVar41;
  int iVar42;
  uint32_t uVar43;
  uint uVar44;
  uint uVar45;
  long lVar46;
  int max_quantization;
  uint uVar47;
  int iVar48;
  long lVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  uint local_a2c;
  ulong local_a28;
  uint8_t *local_a18;
  uint32_t *local_a10;
  uint8_t *tmp8;
  ulong local_9e0;
  int local_9c8;
  int local_9b8;
  uint64_t local_918;
  uint32_t num_pixels [10];
  uint32_t *modes [10];
  uint32_t local_838 [514];
  
  auVar4 = _DAT_001b7040;
  max_quantization =
       1 << (((char)(uint)((ulong)((long)near_lossless_quality * -0x66666667) >> 0x23) -
             (char)((long)near_lossless_quality * -0x66666667 >> 0x3f)) + 5U & 0x1f);
  iVar6 = *percent;
  if (low_effort == 0) {
    uVar23 = 0;
    lVar22 = (long)min_bits;
    if (min_bits <= max_bits) {
      puVar11 = num_pixels + lVar22;
      iVar20 = min_bits;
      do {
        bVar18 = (byte)iVar20;
        iVar42 = 1 << (bVar18 & 0x1f);
        uVar43 = ((uint)(iVar42 + height + -1) >> (bVar18 & 0x1f)) *
                 ((uint)(width + -1 + iVar42) >> (bVar18 & 0x1f));
        *puVar11 = uVar43;
        uVar24 = (int)uVar23 + uVar43;
        uVar23 = (ulong)uVar24;
        puVar11 = puVar11 + 1;
        iVar20 = iVar20 + 1;
      } while (max_bits + 1 != iVar20);
      uVar23 = (ulong)uVar24;
    }
    puVar11 = (uint32_t *)WebPSafeMalloc(uVar23,4);
    if (puVar11 != (uint32_t *)0x0) {
      modes[lVar22] = puVar11;
      uVar24 = max_bits - min_bits;
      if (uVar24 != 0 && min_bits <= max_bits) {
        puVar12 = puVar11;
        lVar39 = lVar22;
        do {
          puVar12 = puVar12 + num_pixels[lVar39];
          modes[lVar39 + 1] = puVar12;
          lVar39 = lVar39 + 1;
        } while (max_bits != lVar39);
      }
      bVar18 = (byte)min_bits;
      uVar5 = 1 << (bVar18 & 0x1f);
      uVar47 = (uVar5 + height) - 1 >> (bVar18 & 0x1f);
      iVar48 = uVar24 + 1;
      puVar12 = (uint32_t *)WebPSafeCalloc((long)(iVar48 * 0x3c0e),4);
      iVar20 = *percent;
      iVar42 = 4;
      if (max_bits < 4) {
        iVar42 = max_bits;
      }
      iVar3 = min_bits;
      if (min_bits < iVar42) {
        iVar3 = iVar42;
      }
      *best_bits = 0;
      if (puVar12 != (uint32_t *)0x0) {
        iVar7 = width + -1;
        local_918 = 0x7fffffffffffffff;
        if (uVar47 != 0) {
          lVar39 = (long)width;
          uVar21 = (iVar3 - min_bits) + 1;
          uVar34 = 2;
          if (2 < uVar21) {
            uVar34 = uVar21;
          }
          uVar21 = ((width + uVar5) - 1 >> (bVar18 & 0x1f)) - 1;
          uVar38 = 0;
          uVar8 = 0;
          uVar29 = 0;
          local_a2c = 0;
          iVar35 = 0;
          local_9c8 = 0;
          do {
            iVar36 = local_a2c << (bVar18 & 0x1f);
            iVar37 = uVar29 << (bVar18 & 0x1f);
            uVar23 = (ulong)(uint)(height - iVar37);
            if ((int)uVar5 < height - iVar37) {
              uVar23 = (ulong)uVar5;
            }
            uVar30 = width - iVar36;
            uVar9 = (uint)(0 < (int)(local_a2c << (bVar18 & 0x1f)));
            uVar33 = (ulong)uVar30;
            if ((int)uVar5 < (int)uVar30) {
              uVar33 = (ulong)uVar5;
            }
            iVar31 = (int)uVar33;
            iVar25 = uVar9 + iVar31;
            lVar41 = (long)(int)(iVar36 - uVar9);
            lVar46 = 0;
            puVar14 = argb_scratch;
            local_a10 = argb_scratch + lVar39 + 1;
            do {
              if (0 < iVar37) {
                memcpy(local_a10 + lVar41,argb + lVar41 + (iVar37 + -1) * width,(long)iVar25 * 4 + 4
                      );
              }
              local_9e0._0_4_ = (int)uVar23;
              if (0 < (int)local_9e0) {
                uVar27 = 0;
                do {
                  puVar40 = puVar14;
                  lVar49 = uVar27 + (long)iVar37;
                  bVar2 = lVar49 < (long)height + -1;
                  memcpy(puVar40 + lVar41,argb + lVar41 + lVar49 * lVar39,
                         (long)(int)(iVar25 + (uint)bVar2) << 2);
                  if (bVar2 && (0 < lVar49 && 1 < max_quantization)) {
                    MaxDiffsForRow((uint)((int)uVar5 < (int)uVar30) + iVar25,width,
                                   argb + lVar41 + lVar49 * lVar39,
                                   (uint8_t *)((long)(argb_scratch + lVar39 * 2 + 2) + lVar41),
                                   used_subtract_green);
                  }
                  GetResidual(width,height,local_a10,puVar40,
                              (uint8_t *)(argb_scratch + lVar39 * 2 + 2),(int)lVar46,iVar36,
                              iVar31 + iVar36,(int)lVar49,max_quantization,exact,used_subtract_green
                              ,local_838);
                  if (0 < iVar31) {
                    uVar13 = 0;
                    do {
                      uVar9 = local_838[uVar13];
                      puVar12[lVar46 * 0x400 + (ulong)(uVar9 >> 0x18)] =
                           puVar12[lVar46 * 0x400 + (ulong)(uVar9 >> 0x18)] + 1;
                      piVar1 = (int *)((long)puVar12 +
                                      (ulong)(uVar9 >> 0xe & 0x3fc) + lVar46 * 0x1000 + 0x400);
                      *piVar1 = *piVar1 + 1;
                      piVar1 = (int *)((long)puVar12 +
                                      (ulong)(uVar9 >> 6 & 0x3fc) + lVar46 * 0x1000 + 0x800);
                      *piVar1 = *piVar1 + 1;
                      puVar12[lVar46 * 0x400 + (ulong)(uVar9 & 0xff) + 0x300] =
                           puVar12[lVar46 * 0x400 + (ulong)(uVar9 & 0xff) + 0x300] + 1;
                      uVar13 = uVar13 + 1;
                    } while (uVar33 != uVar13);
                  }
                  if (min_bits < iVar42) {
                    uVar9 = 1;
                    do {
                      if (0 < iVar31) {
                        iVar26 = uVar9 * 0xe + (int)lVar46;
                        uVar13 = 0;
                        do {
                          uVar44 = local_838[uVar13];
                          puVar12[(long)(iVar26 * 0x400) + (ulong)(uVar44 >> 0x18)] =
                               puVar12[(long)(iVar26 * 0x400) + (ulong)(uVar44 >> 0x18)] + 1;
                          piVar1 = (int *)((long)puVar12 +
                                          (ulong)(uVar44 >> 0xe & 0x3fc) +
                                          (long)(iVar26 * 0x400) * 4 + 0x400);
                          *piVar1 = *piVar1 + 1;
                          piVar1 = (int *)((long)puVar12 +
                                          (ulong)(uVar44 >> 6 & 0x3fc) +
                                          (long)(iVar26 * 0x400) * 4 + 0x800);
                          *piVar1 = *piVar1 + 1;
                          puVar12[(long)(iVar26 * 0x400) + (ulong)(uVar44 & 0xff) + 0x300] =
                               puVar12[(long)(iVar26 * 0x400) + (ulong)(uVar44 & 0xff) + 0x300] + 1;
                          uVar13 = uVar13 + 1;
                        } while (uVar33 != uVar13);
                      }
                      uVar9 = uVar9 + 1;
                    } while (uVar9 != uVar34);
                  }
                  uVar27 = uVar27 + 1;
                  puVar14 = local_a10;
                  local_a10 = puVar40;
                } while (uVar27 != uVar23);
              }
              lVar46 = lVar46 + 1;
            } while (lVar46 != 0xe);
            iVar36 = 0;
            iVar37 = 0;
            uVar9 = 0;
            while( true ) {
              bVar19 = (byte)uVar9;
              uVar44 = local_a2c >> (bVar19 & 0x1f);
              uVar30 = uVar29 >> (bVar19 & 0x1f);
              uVar45 = (uint)((1 << (bVar19 + bVar18 & 0x1f)) + iVar7) >> (bVar19 + bVar18 & 0x1f);
              puVar14 = modes[lVar22 + (int)uVar9];
              local_a28 = 0xff;
              local_9e0 = 0xff;
              if (0 < (int)(local_a2c >> (bVar19 & 0x1f))) {
                local_9e0 = (ulong)*(byte *)((long)puVar14 +
                                            (long)(int)(uVar45 * uVar30 + uVar44) * 4 + -3);
              }
              if (0 < (int)uVar30) {
                local_a28 = (ulong)*(byte *)((long)puVar14 +
                                            (long)(int)((uVar30 - 1) * uVar45 + uVar44) * 4 + 1);
              }
              puVar28 = puVar12 + iVar36;
              iVar25 = uVar9 * 0x3800;
              uVar23 = 0;
              lVar41 = 0x7fffffffffffffff;
              uVar32 = 0;
              puVar40 = puVar12;
              do {
                lVar49 = 0;
                lVar46 = 0;
                do {
                  iVar15 = PredictionCostBias((uint32_t *)((long)puVar28 + lVar49),1,0x5e);
                  uVar16 = (*VP8LCombinedShannonEntropy)
                                     ((uint32_t *)((long)puVar28 + lVar49),
                                      (uint32_t *)
                                      ((long)puVar12 +
                                      lVar49 + (long)iVar37 * 4 + (long)(iVar48 * 0x3800) * 4));
                  lVar46 = uVar16 + iVar15 + lVar46;
                  lVar49 = lVar49 + 0x400;
                } while (lVar49 != 0x1000);
                lVar49 = lVar46 + -0x7800000;
                if (uVar23 != local_9e0) {
                  lVar49 = lVar46;
                }
                lVar46 = lVar49 + -0x7800000;
                if (uVar23 != local_a28) {
                  lVar46 = lVar49;
                }
                if (lVar46 < lVar41) {
                  lVar41 = lVar46;
                  puVar40 = puVar12 + iVar25 + uVar23 * 0x400;
                  uVar32 = (uint)uVar23;
                }
                uVar23 = uVar23 + 1;
                puVar28 = puVar28 + 0x400;
              } while (uVar23 != 0xe);
              (*VP8LAddVectorEq)(puVar40,puVar12 + (long)(iVar48 * 0x3800) +
                                                   (long)(int)(uVar9 << 10),0x400);
              puVar14[(int)(uVar45 * uVar30 + uVar44)] = uVar32 << 8 | 0xff000000;
              puVar12[(long)(iVar48 * 0x3800) +
                      (long)(iVar48 * 0x400) + (long)(int)(uVar9 * 0xe) + (ulong)uVar32] =
                   puVar12[(long)(iVar48 * 0x3800) +
                           (long)(iVar48 * 0x400) + (long)(int)(uVar9 * 0xe) + (ulong)uVar32] + 1;
              if (uVar9 == uVar24) {
                memset(puVar12,0,(ulong)(uVar24 * 0x3800 + 0x3800) << 2);
                local_9c8 = local_9c8 + 1;
                if (local_a2c == uVar21) {
                  local_9c8 = 0;
                }
                iVar35 = iVar35 + (uint)(local_a2c == uVar21);
                uVar8 = 0;
                uVar38 = 0;
                goto LAB_00148824;
              }
              uVar9 = uVar9 + 1;
              if (uVar9 <= uVar24 && (uint)(iVar3 - min_bits) < uVar9) {
                (*VP8LAddVectorEq)(puVar12 + iVar25,puVar12 + (int)(uVar9 * 0x3800),0x3800);
              }
              if (((local_a2c != uVar21) &&
                  ((-1 << ((byte)uVar9 & 0x1f) | 0x7ffffffe - uVar38) != 0xffffffff)) ||
                 ((uVar29 != uVar47 - 1 &&
                  ((-1 << ((byte)uVar9 & 0x1f) | 0x7ffffffe - uVar8) != 0xffffffff)))) break;
              iVar37 = iVar37 + 0x400;
              iVar36 = iVar36 + 0x3800;
            }
            memset(puVar12,0,(ulong)(iVar25 + 0x3800) << 2);
            uVar38 = uVar38 >> (bVar19 & 0x1f);
            uVar8 = uVar8 >> (bVar19 & 0x1f);
            if ((uVar38 & 1) == 0 && local_a2c == uVar21) {
              uVar8 = uVar8 + 1;
            }
            else if ((uVar38 & 1) == 0) {
              uVar38 = uVar38 | 1;
            }
            else {
              uVar8 = uVar8 + 1;
              uVar38 = uVar38 - 1;
            }
            uVar38 = uVar38 << (bVar19 & 0x1f);
            uVar8 = uVar8 << (bVar19 & 0x1f);
LAB_00148824:
            uVar29 = (iVar35 << ((byte)uVar24 & 0x1f)) + uVar8;
            local_a2c = (local_9c8 << ((byte)uVar24 & 0x1f)) + uVar38;
            if ((local_a2c == 0) &&
               (iVar36 = WebPReportProgress(pic,(uVar29 * percent_range) / uVar47 + iVar20,percent),
               iVar36 == 0)) {
              WebPSafeFree(puVar12);
              local_a10 = (uint32_t *)0x0;
              goto LAB_0014899c;
            }
          } while (uVar29 < uVar47);
        }
        iVar20 = 0;
        local_a10 = (uint32_t *)0x0;
        uVar5 = 0;
        do {
          uVar16 = (*VP8LShannonEntropy)
                             (puVar12 + (long)(iVar48 * 0x3800) +
                                        (long)(iVar48 * 0x400) + (ulong)(uVar5 * 0xe),0xe);
          lVar39 = 0;
          do {
            uVar17 = (*VP8LShannonEntropy)
                               ((uint32_t *)
                                ((long)puVar12 +
                                lVar39 + (long)iVar20 * 4 + (long)(iVar48 * 0x3800) * 4),0x100);
            uVar16 = uVar16 + uVar17;
            lVar39 = lVar39 + 0x400;
          } while (lVar39 != 0x1000);
          if ((long)uVar16 < (long)local_918) {
            *best_bits = min_bits + uVar5;
            local_a10 = modes[lVar22 + (ulong)uVar5];
            local_918 = uVar16;
          }
          uVar5 = uVar5 + 1;
          iVar20 = iVar20 + 0x400;
        } while (uVar5 <= uVar24);
        WebPSafeFree(puVar12);
        VP8LOptimizeSampling(local_a10,width,height,*best_bits,9,best_bits);
LAB_0014899c:
        if (*best_bits != 0) {
          bVar18 = (byte)*best_bits;
          iVar20 = 1 << (bVar18 & 0x1f);
          memcpy(image,local_a10,
                 (ulong)(((uint)(iVar20 + height + -1) >> (bVar18 & 0x1f)) *
                        ((uint)(iVar20 + iVar7) >> (bVar18 & 0x1f))) << 2);
          WebPSafeFree(puVar11);
          max_bits = *best_bits;
          local_9b8 = 1 << ((byte)max_bits & 0x1f);
          uVar24 = (uint)(local_9b8 + iVar7) >> ((byte)max_bits & 0x1f);
          goto LAB_00147b7e;
        }
      }
      WebPSafeFree(puVar11);
    }
    iVar6 = 0;
  }
  else {
    bVar18 = (byte)max_bits;
    local_9b8 = 1 << (bVar18 & 0x1f);
    uVar24 = (width + local_9b8) - 1U >> (bVar18 & 0x1f);
    uVar5 = ((height + local_9b8) - 1U >> (bVar18 & 0x1f)) * uVar24;
    if (0 < (int)uVar5) {
      lVar22 = (ulong)uVar5 - 1;
      auVar50._8_4_ = (int)lVar22;
      auVar50._0_8_ = lVar22;
      auVar50._12_4_ = (int)((ulong)lVar22 >> 0x20);
      uVar23 = 0;
      auVar50 = auVar50 ^ _DAT_001b7040;
      auVar51 = _DAT_001b7030;
      auVar52 = _DAT_001b6e50;
      do {
        auVar53 = auVar52 ^ auVar4;
        iVar20 = auVar50._4_4_;
        if ((bool)(~(auVar53._4_4_ == iVar20 && auVar50._0_4_ < auVar53._0_4_ ||
                    iVar20 < auVar53._4_4_) & 1)) {
          image[uVar23] = 0xff000b00;
        }
        if ((auVar53._12_4_ != auVar50._12_4_ || auVar53._8_4_ <= auVar50._8_4_) &&
            auVar53._12_4_ <= auVar50._12_4_) {
          image[uVar23 + 1] = 0xff000b00;
        }
        auVar53 = auVar51 ^ auVar4;
        iVar42 = auVar53._4_4_;
        if (iVar42 <= iVar20 && (iVar42 != iVar20 || auVar53._0_4_ <= auVar50._0_4_)) {
          image[uVar23 + 2] = 0xff000b00;
          image[uVar23 + 3] = 0xff000b00;
        }
        uVar23 = uVar23 + 4;
        lVar22 = auVar52._8_8_;
        auVar52._0_8_ = auVar52._0_8_ + 4;
        auVar52._8_8_ = lVar22 + 4;
        lVar22 = auVar51._8_8_;
        auVar51._0_8_ = auVar51._0_8_ + 4;
        auVar51._8_8_ = lVar22 + 4;
      } while ((uVar5 + 3 & 0xfffffffc) != uVar23);
    }
    *best_bits = max_bits;
LAB_00147b7e:
    if (0 < height) {
      lVar22 = (long)width;
      tmp8 = (uint8_t *)(argb_scratch + lVar22 * 2 + 2);
      local_a18 = (uint8_t *)((long)argb_scratch + lVar22 * 9 + 8);
      uVar23 = (ulong)(uint)height;
      puVar11 = argb_scratch + lVar22 + 1;
      uVar33 = 0;
      do {
        puVar14 = argb_scratch;
        puVar12 = argb + uVar33 * lVar22;
        uVar27 = uVar33 + 1;
        memcpy(puVar14,puVar12,(long)(int)(width + (uint)(uVar27 < uVar23)) << 2);
        if (low_effort == 0) {
          max_diffs = tmp8;
          if ((1 < max_quantization) &&
             (max_diffs = local_a18, local_a18 = tmp8, uVar33 + 2 < uVar23)) {
            MaxDiffsForRow(width,width,argb + uVar27 * lVar22,tmp8,used_subtract_green);
          }
          tmp8 = max_diffs;
          if (0 < width) {
            iVar20 = 0;
            do {
              iVar48 = iVar20 + local_9b8;
              iVar42 = width;
              if (iVar48 < width) {
                iVar42 = iVar48;
              }
              GetResidual(width,height,puVar11,puVar14,max_diffs,
                          (uint)*(byte *)((long)image +
                                         (long)(int)((iVar20 >> ((byte)max_bits & 0x1f)) +
                                                    ((uint)uVar33 >> ((byte)max_bits & 0x1f)) *
                                                    uVar24) * 4 + 1),iVar20,iVar42,(uint)uVar33,
                          max_quantization,exact,used_subtract_green,puVar12 + iVar20);
              iVar20 = iVar42;
            } while (iVar48 < width);
          }
        }
        else {
          pp_Var10 = VP8LPredictorsSub + 2;
          puVar40 = puVar11;
          if (uVar33 == 0) {
            pp_Var10 = VP8LPredictorsSub;
            puVar40 = (uint32_t *)0x0;
          }
          (**pp_Var10)(puVar14,puVar40,1,puVar12);
          if (uVar33 == 0) {
            (*VP8LPredictorsSub[1])(puVar14 + 1,(uint32_t *)0x0,width + -1,puVar12 + 1);
          }
          else {
            (*VP8LPredictorsSub[0xb])(puVar14 + 1,puVar11 + 1,width + -1,puVar12 + 1);
          }
        }
        argb_scratch = puVar11;
        puVar11 = puVar14;
        uVar33 = uVar27;
      } while (uVar27 != uVar23);
    }
    iVar6 = WebPReportProgress(pic,iVar6 + percent_range,percent);
  }
  return iVar6;
}

Assistant:

int VP8LResidualImage(int width, int height, int min_bits, int max_bits,
                      int low_effort, uint32_t* const argb,
                      uint32_t* const argb_scratch, uint32_t* const image,
                      int near_lossless_quality, int exact,
                      int used_subtract_green, const WebPPicture* const pic,
                      int percent_range, int* const percent,
                      int* const best_bits) {
  int percent_start = *percent;
  const int max_quantization = 1 << VP8LNearLosslessBits(near_lossless_quality);
  if (low_effort) {
    const int tiles_per_row = VP8LSubSampleSize(width, max_bits);
    const int tiles_per_col = VP8LSubSampleSize(height, max_bits);
    int i;
    for (i = 0; i < tiles_per_row * tiles_per_col; ++i) {
      image[i] = ARGB_BLACK | (kPredLowEffort << 8);
    }
    *best_bits = max_bits;
  } else {
    // Allocate data to try all samplings from min_bits to max_bits.
    int bits;
    uint32_t sum_num_pixels = 0u;
    uint32_t *modes_raw, *best_mode;
    uint32_t* modes[MAX_TRANSFORM_BITS + 1];
    uint32_t num_pixels[MAX_TRANSFORM_BITS + 1];
    for (bits = min_bits; bits <= max_bits; ++bits) {
      const int tiles_per_row = VP8LSubSampleSize(width, bits);
      const int tiles_per_col = VP8LSubSampleSize(height, bits);
      num_pixels[bits] = tiles_per_row * tiles_per_col;
      sum_num_pixels += num_pixels[bits];
    }
    modes_raw = (uint32_t*)WebPSafeMalloc(sum_num_pixels, sizeof(*modes_raw));
    if (modes_raw == NULL) return 0;
    // Have modes point to the right global memory modes_raw.
    modes[min_bits] = modes_raw;
    for (bits = min_bits + 1; bits <= max_bits; ++bits) {
      modes[bits] = modes[bits - 1] + num_pixels[bits - 1];
    }
    // Find the best sampling.
    GetBestPredictorsAndSubSampling(
        width, height, min_bits, max_bits, argb_scratch, argb, max_quantization,
        exact, used_subtract_green, pic, percent_range, percent,
        &modes[min_bits], best_bits, &best_mode);
    if (*best_bits == 0) {
      WebPSafeFree(modes_raw);
      return 0;
    }
    // Keep the best predictor image.
    memcpy(image, best_mode,
           VP8LSubSampleSize(width, *best_bits) *
               VP8LSubSampleSize(height, *best_bits) * sizeof(*image));
    WebPSafeFree(modes_raw);
  }

  CopyImageWithPrediction(width, height, *best_bits, image, argb_scratch, argb,
                          low_effort, max_quantization, exact,
                          used_subtract_green);
  return WebPReportProgress(pic, percent_start + percent_range, percent);
}